

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtuiohandler.cpp
# Opt level: O1

void __thiscall QTuioHandler::process2DCurAlive(QTuioHandler *this,QOscMessage *message)

{
  QTuioHandler *this_00;
  undefined8 uVar1;
  int *piVar2;
  QDebug this_01;
  bool bVar3;
  int iVar4;
  Stream *__old_val;
  totally_ordered_wrapper<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_*>
  tVar5;
  QMap<int,_QTuioCursor> QVar6;
  QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>
  *pQVar7;
  _Base_ptr asize;
  long lVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  QByteArrayView QVar10;
  int cursorId;
  QMap<int,_QTuioCursor> oldActiveCursors;
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_>
  copy;
  QDebug local_c0;
  QDebug local_b8;
  QDebug local_b0;
  QMap<int,_QTuioCursor> local_a8;
  QMap<int,_QTuioCursor> local_a0;
  QArrayDataPointer<QVariant> local_98;
  undefined1 local_78 [20];
  float local_64;
  State local_60;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_98.d = (message->m_arguments).d.d;
  local_98.ptr = (message->m_arguments).d.ptr;
  local_98.size = (message->m_arguments).d.size;
  if (local_98.d != (Data *)0x0) {
    LOCK();
    ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_a0.d.d.ptr =
       *(QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_>
         *)(this + 0x28);
  if (local_a0.d.d.ptr !=
      (totally_ordered_wrapper<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_*>
       )0x0) {
    LOCK();
    *(int *)local_a0.d.d.ptr = *(int *)local_a0.d.d.ptr + 1;
    UNLOCK();
  }
  local_a8.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_>
        )(totally_ordered_wrapper<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_*>
          )0x0;
  if (1 < (ulong)local_98.size) {
    uVar9 = 1;
    lVar8 = 0x20;
    do {
      iVar4 = QVariant::typeId((QVariant *)((long)&((local_98.ptr)->d).data + lVar8));
      if (iVar4 != 2) {
        lcTuioHandler();
        if (((byte)lcTuioHandler::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1)
            != 0) {
          local_58._0_4_ = 2;
          local_58._4_4_ = 0.0;
          local_58._8_4_ = 0.0;
          local_58._12_4_ = 0.0;
          local_58._16_4_ = 0.0;
          local_58._20_4_ = 0.0;
          local_58._24_8_ = lcTuioHandler::category.name;
          QMessageLogger::warning();
          this_01.stream = local_c0.stream;
          QVar10.m_data = (storage_type *)0x3f;
          QVar10.m_size = (qsizetype)local_78;
          QString::fromUtf8(QVar10);
          QTextStream::operator<<((QTextStream *)this_01.stream,(QString *)local_78);
          piVar2 = (int *)CONCAT44(local_78._4_4_,local_78._0_4_);
          if (piVar2 != (int *)0x0) {
            LOCK();
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (*piVar2 == 0) {
              QArrayData::deallocate((QArrayData *)CONCAT44(local_78._4_4_,local_78._0_4_),2,0x10);
            }
          }
          if (*(QTextStream *)(local_c0.stream + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_c0.stream,' ');
          }
          QTextStream::operator<<((QTextStream *)local_c0.stream,(int)uVar9);
          if (*(QTextStream *)(local_c0.stream + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_c0.stream,' ');
          }
          *(int *)(local_c0.stream + 0x28) = *(int *)(local_c0.stream + 0x28) + 1;
          local_b8.stream = (Stream *)0x0;
          local_78._0_4_ = SUB84(local_c0.stream,0);
          local_78._4_4_ = (undefined4)((ulong)local_c0.stream >> 0x20);
          QtPrivate::printSequentialContainer<QList<QVariant>>
                    ((QtPrivate *)&local_b0,(Stream *)local_78,"QList",(QList<QVariant> *)&local_98)
          ;
          QDebug::~QDebug((QDebug *)local_78);
          QTextStream::operator<<
                    ((QTextStream *)CONCAT44(local_b0.stream._4_4_,(int)local_b0.stream),')');
          if (((QTextStream *)CONCAT44(local_b0.stream._4_4_,(int)local_b0.stream))[0x30] ==
              (QTextStream)0x1) {
            QTextStream::operator<<
                      ((QTextStream *)CONCAT44(local_b0.stream._4_4_,(int)local_b0.stream),' ');
          }
          QDebug::~QDebug(&local_b0);
          QDebug::~QDebug(&local_b8);
          QDebug::~QDebug(&local_c0);
        }
        goto LAB_0010a19d;
      }
      local_b0.stream._0_4_ = QVariant::toInt((bool *)((long)&((local_98.ptr)->d).data + lVar8));
      bVar3 = QMap<int,_QTuioCursor>::contains(&local_a0,(int *)&local_b0);
      if (bVar3) {
        local_58._0_4_ = -0x55555556;
        local_58._20_4_ = -NAN;
        local_58._4_4_ = -NAN;
        local_58._8_4_ = -NAN;
        local_58._12_4_ = -NAN;
        local_58._16_4_ = -NAN;
        local_58._24_4_ = 0xaaaaaaaa;
        local_78._0_4_ = -1;
        local_78._4_4_ = 0.0;
        local_78._8_12_ = SUB1612((undefined1  [16])0x0,4);
        local_64 = 0.0;
        local_60 = Pressed;
        QMap<int,_QTuioCursor>::value
                  ((QTuioCursor *)local_58,&local_a0,(int *)&local_b0,(QTuioCursor *)local_78);
        local_58[0x18] = 4;
        QMap<int,_QTuioCursor>::insert(&local_a8,(int *)&local_b0,(QTuioCursor *)local_58);
        QMap<int,_QTuioCursor>::remove(&local_a0,(char *)&local_b0);
      }
      else {
        local_58._24_4_ = 0xaaaaaaaa;
        local_58._0_4_ = (int)local_b0.stream;
        local_58._4_4_ = 0.0;
        local_58._8_4_ = 0.0;
        local_58._12_4_ = 0.0;
        local_58._16_4_ = 0.0;
        local_58._20_4_ = 0.0;
        local_58[0x18] = 1;
        QMap<int,_QTuioCursor>::insert(&local_a8,(int *)&local_b0,(QTuioCursor *)local_58);
      }
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x20;
    } while (uVar9 < (ulong)local_98.size);
  }
  if (local_a0.d.d.ptr ==
      (totally_ordered_wrapper<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_*>
       )0x0) {
    tVar5.ptr = (QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>
                 *)0x0;
  }
  else {
    tVar5.ptr = *(QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>
                  **)((long)local_a0.d.d.ptr + 0x20);
  }
  this_00 = this + 0x30;
  if (local_a0.d.d.ptr ==
      (totally_ordered_wrapper<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_*>
       )0x0) {
    asize = (_Base_ptr)0x0;
  }
  else {
    asize = *(_Base_ptr *)((long)local_a0.d.d.ptr + 0x30);
  }
  QList<QTuioCursor>::reserve((QList<QTuioCursor> *)this_00,(qsizetype)asize);
  pQVar7 = (QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>
            *)((long)local_a0.d.d.ptr + 0x10);
  if (local_a0.d.d.ptr ==
      (totally_ordered_wrapper<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_*>
       )0x0) {
    pQVar7 = (QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>
              *)0x0;
  }
  if (tVar5.ptr != pQVar7) {
    do {
      QtPrivate::QMovableArrayOps<QTuioCursor>::emplace<QTuioCursor_const&>
                ((QMovableArrayOps<QTuioCursor> *)this_00,*(qsizetype *)(this + 0x40),
                 (QTuioCursor *)
                 ((long)&((tVar5.ptr)->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 4))
      ;
      QList<QTuioCursor>::end((QList<QTuioCursor> *)this_00);
      tVar5.ptr = (QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>
                   *)std::_Rb_tree_increment(tVar5.ptr);
      QVar6.d.d.ptr = local_a0.d.d.ptr;
      if (local_a0.d.d.ptr !=
          (totally_ordered_wrapper<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_*>
           )0x0) {
        QVar6.d.d.ptr =
             (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_>
              )(totally_ordered_wrapper<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_*>
                )((long)local_a0.d.d.ptr + 0x10);
      }
    } while ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_>
              )tVar5.ptr != QVar6.d.d.ptr);
  }
  if (local_a8.d.d.ptr !=
      (totally_ordered_wrapper<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_*>
       )0x0) {
    LOCK();
    *(int *)local_a8.d.d.ptr = *(int *)local_a8.d.d.ptr + 1;
    UNLOCK();
  }
  uVar1 = *(undefined8 *)(this + 0x28);
  *(QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_>
    *)(this + 0x28) = local_a8.d.d.ptr;
  local_58._0_4_ = (undefined4)uVar1;
  local_58._4_4_ = (undefined4)((ulong)uVar1 >> 0x20);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2
            ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_>
              *)local_58);
LAB_0010a19d:
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_a8.d);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_a0.d);
  QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTuioHandler::process2DCurAlive(const QOscMessage &message)
{
    QList<QVariant> arguments = message.arguments();

    // delta the notified cursors that are active, against the ones we already
    // know of.
    //
    // TBD: right now we're assuming one 2Dcur alive message corresponds to a
    // new data source from the input. is this correct, or do we need to store
    // changes and only process the deltas on fseq?
    QMap<int, QTuioCursor> oldActiveCursors = m_activeCursors;
    QMap<int, QTuioCursor> newActiveCursors;

    for (int i = 1; i < arguments.size(); ++i) {
        if (QMetaType::Type(arguments.at(i).userType()) != QMetaType::Int) {
            qCWarning(lcTuioHandler) << "Ignoring malformed TUIO alive message (bad argument on position" << i << arguments << ')';
            return;
        }

        int cursorId = arguments.at(i).toInt();
        if (!oldActiveCursors.contains(cursorId)) {
            // newly active
            QTuioCursor cursor(cursorId);
            cursor.setState(QEventPoint::State::Pressed);
            newActiveCursors.insert(cursorId, cursor);
        } else {
            // we already know about it, remove it so it isn't marked as released
            QTuioCursor cursor = oldActiveCursors.value(cursorId);
            cursor.setState(QEventPoint::State::Stationary); // position change in SET will update if needed
            newActiveCursors.insert(cursorId, cursor);
            oldActiveCursors.remove(cursorId);
        }
    }

    // anything left is dead now
    QMap<int, QTuioCursor>::ConstIterator it = oldActiveCursors.constBegin();

    // deadCursors should be cleared from the last FSEQ now
    m_deadCursors.reserve(oldActiveCursors.size());

    // TODO: there could be an issue of resource exhaustion here if FSEQ isn't
    // sent in a timely fashion. we should probably track message counts and
    // force-flush if we get too many built up.
    while (it != oldActiveCursors.constEnd()) {
        m_deadCursors.append(it.value());
        ++it;
    }

    m_activeCursors = newActiveCursors;
}